

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::EnterComputationBlock(BP5Writer *this)

{
  long in_RDI;
  TimePoint this_00;
  
  if ((*(int *)(in_RDI + 0x1bc) != 0) && ((*(byte *)(in_RDI + 0x84) & 1) == 0)) {
    this_00 = Now();
    ((duration *)(in_RDI + 0xd18))->__r = (rep_conflict)this_00.__d.__r;
    shm::Spinlock::lock((Spinlock *)this_00.__d.__r);
    *(undefined1 *)(in_RDI + 0xd11) = 1;
    shm::Spinlock::unlock((Spinlock *)this_00.__d.__r);
  }
  return;
}

Assistant:

void BP5Writer::EnterComputationBlock() noexcept
{
    if (m_Parameters.AsyncWrite && !m_BetweenStepPairs)
    {
        m_ComputationBlockStart = Now();
        {
            m_AsyncWriteLock.lock();
            m_InComputationBlock = true;
            m_AsyncWriteLock.unlock();
        }
    }
}